

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastGtS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  MessageLite *pMVar7;
  ulong uVar8;
  ushort *puVar9;
  char *pcVar10;
  ushort *puVar11;
  string *psVar12;
  undefined8 uVar13;
  uint *puVar14;
  undefined8 uVar15;
  Arena *arena;
  undefined8 uVar16;
  long *plVar17;
  int iVar18;
  long lVar19;
  ushort *local_48 [2];
  long local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  bVar1 = *ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar14 & 3) != 0) {
      AlignFail(puVar14);
    }
    *puVar14 = *puVar14 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar17 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar17 & 7) != 0) {
    AlignFail(plVar17);
  }
  lVar3 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  if (*plVar17 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar7 = ClassData::New(*(ClassData **)(lVar3 + 0x20),arena);
    *plVar17 = (long)pMVar7;
  }
  iVar18 = ctx->depth_;
  local_38 = (long)iVar18 + -1;
  ctx->depth_ = (int)local_38;
  if ((long)iVar18 < 1) {
    puVar9 = (ushort *)0x0;
  }
  else {
    local_48[0] = (ushort *)(ptr + 1);
    lVar19 = (long)ctx->group_depth_ + 1;
    iVar18 = (int)lVar19;
    ctx->group_depth_ = iVar18;
    lVar4 = *plVar17;
    while (bVar5 = EpsCopyInputStream::DoneWithCheck
                             (&ctx->super_EpsCopyInputStream,(char **)local_48,ctx->group_depth_),
          !bVar5) {
      uVar6 = (uint)*(byte *)(lVar3 + 8) & (uint)*local_48[0];
      if ((uVar6 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar8 = (ulong)(uVar6 & 0xfffffff8);
      local_48[0] = (ushort *)
                    (**(code **)(lVar3 + 0x38 + uVar8 * 2))
                              (lVar4,local_48[0],ctx,
                               (ulong)*local_48[0] ^ *(ulong *)(lVar3 + 0x40 + uVar8 * 2),lVar3,0);
      if ((local_48[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)
         ) break;
    }
    puVar11 = local_48[0];
    if ((*(byte *)(lVar3 + 9) & 1) != 0) {
      puVar11 = (ushort *)(**(code **)(lVar3 + 0x28))(lVar4,local_48[0],ctx);
    }
    if (puVar11 != (ushort *)0x0) {
      if ((int)local_38 == ctx->depth_) {
        psVar12 = (string *)0x0;
      }
      else {
        psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            (local_38,(long)ctx->depth_,"old_depth == depth_");
      }
      if (psVar12 != (string *)0x0) {
        uVar16 = *(undefined8 *)psVar12;
        uVar13 = *(undefined8 *)(psVar12 + 8);
        uVar15 = 0x45b;
LAB_0014e276:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_48,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar15,uVar13,uVar16);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_48);
      }
      if (iVar18 == ctx->group_depth_) {
        psVar12 = (string *)0x0;
      }
      else {
        psVar12 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            (lVar19,(long)ctx->group_depth_,"old_group_depth == group_depth_");
      }
      if (psVar12 != (string *)0x0) {
        uVar16 = *(undefined8 *)psVar12;
        uVar13 = *(undefined8 *)(psVar12 + 8);
        uVar15 = 0x45c;
        goto LAB_0014e276;
      }
    }
    ctx->group_depth_ = ctx->group_depth_ + -1;
    ctx->depth_ = ctx->depth_ + 1;
    uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar9 = (ushort *)0x0;
    if (uVar2 == bVar1) {
      puVar9 = puVar11;
    }
  }
  return (char *)puVar9;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}